

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolygonTessellation.h
# Opt level: O0

void anurbs::PolygonTessellation::register_python(module *m)

{
  char *name_00;
  class_<anurbs::PolygonTessellation> *pcVar1;
  arg aVar2;
  undefined1 local_b8;
  arg local_b0;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 local_88;
  arg local_80;
  arg local_70;
  code *local_60;
  undefined8 local_58;
  constructor<> local_4d [13];
  handle local_40;
  class_<anurbs::PolygonTessellation> local_38;
  string local_30 [8];
  string name;
  module *m_local;
  
  name.field_2._8_8_ = m;
  python_name_abi_cxx11_();
  local_40.m_ptr = *(PyObject **)name.field_2._8_8_;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::PolygonTessellation>::class_<>(&local_38,local_40,name_00);
  pybind11::init<>();
  pcVar1 = pybind11::class_<anurbs::PolygonTessellation>::def<>(&local_38,local_4d);
  local_60 = compute;
  local_58 = 0;
  local_80 = pybind11::literals::operator____a("polygon",7);
  local_70.name = local_80.name;
  local_70._8_1_ = local_80._8_1_;
  pcVar1 = pybind11::class_<anurbs::PolygonTessellation>::
           def<void(anurbs::PolygonTessellation::*)(anurbs::Polygon_const&),pybind11::arg>
                     (pcVar1,"compute",(offset_in_Model_to_subr *)&local_60,&local_70);
  local_90 = nb_triangles;
  local_88 = 0;
  pcVar1 = pybind11::class_<anurbs::PolygonTessellation>::
           def<long(anurbs::PolygonTessellation::*)()const>
                     (pcVar1,"nb_triangles",(offset_in_Model_to_subr *)&local_90);
  local_a0 = triangle;
  local_98 = 0;
  aVar2 = pybind11::literals::operator____a("index",5);
  local_b0.name = aVar2.name;
  local_b8 = aVar2._8_1_;
  local_b0._8_1_ = local_b8;
  pybind11::class_<anurbs::PolygonTessellation>::
  def<std::tuple<long,long,long>(anurbs::PolygonTessellation::*)(long)const,pybind11::arg>
            (pcVar1,"triangle",(offset_in_Model_to_subr *)&local_a0,&local_b0);
  pybind11::class_<anurbs::PolygonTessellation>::~class_(&local_38);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = PolygonTessellation;

        const std::string name = Type::python_name();

        py::class_<Type>(m, name.c_str())
            .def(py::init<>())
            .def("compute", &Type::compute, "polygon"_a)
            .def("nb_triangles", &Type::nb_triangles)
            .def("triangle", &Type::triangle, "index"_a)
        ;
    }